

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O3

void store_number(char *dest,uint number)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)number;
  sVar3 = strlen(dest);
  uVar2 = (uint)sVar3;
  uVar4 = uVar6;
  if (number == 0) {
    dest[uVar2 + 2] = '\0';
    dest[uVar2 + 1] = '0';
  }
  else {
    do {
      uVar2 = (uint)uVar4;
      iVar1 = (int)sVar3;
      sVar3 = (size_t)(iVar1 + 1);
      uVar4 = uVar4 / 10;
    } while (9 < uVar2);
    dest[iVar1 + 2] = '\0';
    do {
      uVar5 = (uint)uVar6;
      dest[sVar3] = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
      uVar2 = (int)sVar3 - 1;
      sVar3 = (size_t)uVar2;
      uVar6 = uVar6 / 10;
    } while (9 < uVar5);
  }
  dest[uVar2] = '_';
  return;
}

Assistant:

void
store_number(char *dest, unsigned number)
{
  unsigned i = strlen(dest) + num_length(number);
  dest[i] = '\0';
  if (number) {
    --i;
    while (number > 0) {
      unsigned digit = number % 10;
      dest[i] = '0' + digit;
      number /= 10;
      --i;
    }
  } else {
    dest[i - 1] = '0';
    i -= 2;
  }
  dest[i] = '_';
}